

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Writer::EnterComputationBlock(BP5Writer *this)

{
  TimePoint TVar1;
  
  if (((this->super_BP5Engine).m_Parameters.AsyncWrite != 0) &&
     ((this->super_Engine).m_BetweenStepPairs == false)) {
    TVar1 = Now();
    (this->m_ComputationBlockStart).__d.__r = (rep_conflict)TVar1.__d.__r;
    shm::Spinlock::lock(&this->m_AsyncWriteLock);
    this->m_InComputationBlock = true;
    shm::Spinlock::unlock(&this->m_AsyncWriteLock);
  }
  return;
}

Assistant:

void BP5Writer::EnterComputationBlock() noexcept
{
    if (m_Parameters.AsyncWrite && !m_BetweenStepPairs)
    {
        m_ComputationBlockStart = Now();
        {
            m_AsyncWriteLock.lock();
            m_InComputationBlock = true;
            m_AsyncWriteLock.unlock();
        }
    }
}